

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O2

void store_mf(int fd,memfile *mf)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  
  iVar1 = mf->pos;
  iVar3 = iVar1;
  do {
    if (iVar3 == 0) break;
    sVar2 = write(fd,mf->buf + (iVar1 - iVar3),(long)iVar3);
    iVar3 = iVar3 - (int)sVar2;
  } while ((int)sVar2 != -1);
  mfree(mf);
  mnew(mf,(memfile *)0x0);
  return;
}

Assistant:

void store_mf(int fd, struct memfile *mf)
{
	int len, left, ret;
	
	len = left = mf->pos;
	while (left) {
	    ret = write(fd, &mf->buf[len - left], left);
	    if (ret == -1) /* error */
		goto out;
	    left -= ret;
	}

out:
	mfree(mf);
	mnew(mf, NULL);
}